

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEPlanet.cpp
# Opt level: O0

bool __thiscall test_CEPlanet::test_earth(test_CEPlanet *this)

{
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  byte bVar1;
  vector<double,_std::allocator<double>_> *in_RDI;
  CEPlanet earth;
  CEPlanet *this_00;
  CESkyCoordType *coord_type;
  CEAngle *in_stack_fffffffffffffd40;
  CEAngle *in_stack_fffffffffffffd48;
  allocator_type *__a;
  CESkyCoord *in_stack_fffffffffffffd50;
  vector<double,_std::allocator<double>_> *this_01;
  iterator in_stack_fffffffffffffd58;
  iterator pdVar2;
  size_type in_stack_fffffffffffffd60;
  undefined1 local_288 [32];
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 *local_250;
  undefined8 local_248;
  undefined1 local_240 [24];
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  CEPlanet *in_stack_fffffffffffffde0;
  undefined1 local_1f0 [52];
  undefined4 local_1bc;
  undefined8 local_1b8;
  undefined8 local_1a0;
  undefined1 local_188 [64];
  undefined1 local_148 [328];
  
  CEPlanet::Earth();
  coord_type = (CESkyCoordType *)CEDate::JD((CEDate *)(in_RDI + 0x1e));
  CEPlanet::UpdateCoordinates
            (in_stack_fffffffffffffde0,
             (double)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  local_1a0 = 0x405970fe2c173af1;
  CEAngle::Deg(in_stack_fffffffffffffd58);
  local_1b8 = 0x403702a5def535c9;
  CEAngle::Deg(in_stack_fffffffffffffd58);
  local_1bc = 1;
  CESkyCoord::CESkyCoord
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
             coord_type);
  CEAngle::Deg(in_stack_fffffffffffffd58);
  CEAngle::Deg(in_stack_fffffffffffffd58);
  CESkyCoord::CESkyCoord
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
             coord_type);
  local_268 = 0xbfc796a0d64ed6a8;
  uStack_260 = 0x3fec501cc88da2eb;
  local_258 = 0x3fd8907d912556d2;
  local_250 = &local_268;
  local_248 = 3;
  std::allocator<double>::allocator((allocator<double> *)0x11f55b);
  __l._M_len = in_stack_fffffffffffffd60;
  __l._M_array = in_stack_fffffffffffffd58;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd50,__l,
             (allocator_type *)in_stack_fffffffffffffd48);
  __a = (allocator_type *)0xbf919d74c579c741;
  this_01 = (vector<double,_std::allocator<double>_> *)0xbf67cc7fcae66db3;
  pdVar2 = (iterator)0xbf54a2cf4d5aa6c0;
  this_00 = (CEPlanet *)&stack0xfffffffffffffd47;
  std::allocator<double>::allocator((allocator<double> *)0x11f5bc);
  __l_00._M_len = in_stack_fffffffffffffd60;
  __l_00._M_array = pdVar2;
  std::vector<double,_std::allocator<double>_>::vector(this_01,__l_00,__a);
  (*(code *)(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[0x19])
            (in_RDI,local_148,local_188,local_1f0,local_240,local_288);
  std::vector<double,_std::allocator<double>_>::~vector(in_RDI);
  std::allocator<double>::~allocator((allocator<double> *)0x11f623);
  std::vector<double,_std::allocator<double>_>::~vector(in_RDI);
  std::allocator<double>::~allocator((allocator<double> *)0x11f63a);
  CESkyCoord::~CESkyCoord((CESkyCoord *)this_00);
  CEAngle::~CEAngle((CEAngle *)0x11f654);
  CEAngle::~CEAngle((CEAngle *)0x11f661);
  CESkyCoord::~CESkyCoord((CESkyCoord *)this_00);
  CEAngle::~CEAngle((CEAngle *)0x11f67b);
  CEAngle::~CEAngle((CEAngle *)0x11f688);
  bVar1 = (*(code *)(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[3])();
  CEPlanet::~CEPlanet(this_00);
  return (bool)(bVar1 & 1);
}

Assistant:

bool test_CEPlanet::test_earth(void)
{
    // Create the planet object
    CEPlanet earth = CEPlanet::Earth();

    // Update the coordinates
    earth.UpdateCoordinates(base_date_.JD());

    // Run the actual test with values derived from AstroPy
    test_planet(earth,
                CESkyCoord(CEAngle::Deg(101.7655134417398273), 
                           CEAngle::Deg(23.0103434895188776), 
                           CESkyCoordType::ICRS),
                CESkyCoord(CEAngle::Deg(89.9999999991386233),
                           CEAngle::Deg(179.9999111107912881),
                           CESkyCoordType::OBSERVED),
                {-0.18428431, 0.88477935, 0.383819},
                {-0.01720221, -0.00290513, -0.00125952});
    
    return pass();
}